

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRGenerator.cc
# Opt level: O2

int __thiscall
flow::lang::IRGenerator::accept(IRGenerator *this,int __fd,sockaddr *__addr,socklen_t *__addr_len)

{
  int iVar1;
  ConstantInt *groupId;
  Value *pVVar2;
  undefined4 in_register_00000034;
  allocator<char> local_41;
  string local_40;
  
  groupId = IRBuilder::get(&this->super_IRBuilder,
                           *(int64_t *)(CONCAT44(in_register_00000034,__fd) + 0x40));
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"",&local_41);
  pVVar2 = (Value *)IRBuilder::createRegExpGroup(&this->super_IRBuilder,groupId,&local_40);
  this->result_ = pVVar2;
  iVar1 = std::__cxx11::string::~string((string *)&local_40);
  return iVar1;
}

Assistant:

void IRGenerator::accept(RegExpGroupExpr& expr) {
  result_ = createRegExpGroup(get(expr.groupId()));
}